

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

VarInfo * gola_findlabel(LexState *ls,GCstr *name)

{
  VarInfo *ve;
  VarInfo *v;
  GCstr *name_local;
  LexState *ls_local;
  
  ve = ls->vstack + ls->fs->bl->vstart;
  while( true ) {
    if (ls->vstack + ls->vtop <= ve) {
      return (VarInfo *)0x0;
    }
    if (((GCstr *)(ve->name).gcptr64 == name) && ((ve->info & 4) != 0)) break;
    ve = ve + 1;
  }
  return ve;
}

Assistant:

static VarInfo *gola_findlabel(LexState *ls, GCstr *name)
{
  VarInfo *v = ls->vstack + ls->fs->bl->vstart;
  VarInfo *ve = ls->vstack + ls->vtop;
  for (; v < ve; v++)
    if (strref(v->name) == name && gola_islabel(v))
      return v;
  return NULL;
}